

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O2

loader_manager_impl loader_manager_impl_initialize(void)

{
  int iVar1;
  loader_manager_impl __ptr;
  vector pvVar2;
  set psVar3;
  long lVar4;
  undefined8 *puVar5;
  void *pvVar6;
  uint64_t uVar7;
  plugin ppVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  size_t __size;
  ulong local_1050;
  portability_working_path_length cwd_path_str_length;
  vector local_1040;
  portability_working_path_str cwd_path_str;
  
  __ptr = (loader_manager_impl)malloc(0x28);
  if (__ptr == (loader_manager_impl)0x0) {
    log_write_impl_va("metacall",0x86,"loader_manager_impl_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                      ,3,"Loader failed to allocate its implementation");
  }
  else {
    pvVar2 = (vector)vector_create(0x18);
    __ptr->initialization_order = pvVar2;
    if (pvVar2 == (vector)0x0) {
      log_write_impl_va("metacall",0x8e,"loader_manager_impl_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                        ,3,"Loader failed to allocate the initialization order vector");
    }
    else {
      psVar3 = (set)set_create(hash_callback_ptr);
      __ptr->destroy_map = psVar3;
      if (psVar3 == (set)0x0) {
        log_write_impl_va("metacall",0x96,"loader_manager_impl_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                          ,3,"Loader failed to allocate the destroy map");
      }
      else {
        memset(cwd_path_str,0,0x1000);
        cwd_path_str_length = 0;
        local_1050 = 0;
        pvVar2 = (vector)vector_create(8);
        if (pvVar2 != (vector)0x0) {
          iVar1 = portability_working_path(cwd_path_str,&cwd_path_str_length);
          if (iVar1 == 0) {
            lVar4 = cwd_path_str_length + 1;
            pcVar9 = cwd_path_str;
          }
          else {
            pcVar9 = ".";
            lVar4 = 2;
          }
          lVar4 = environment_variable_path_create("LOADER_SCRIPT_PATH",pcVar9,lVar4,&local_1050);
          log_write_impl_va("metacall",0x50,"loader_manager_impl_script_paths_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,0,"Loader script path: %s",lVar4);
          uVar11 = 0;
          local_1040 = pvVar2;
          do {
            pvVar2 = local_1040;
            __size = 1;
            uVar10 = uVar11;
            while( true ) {
              if (local_1050 <= uVar10) {
                environment_variable_path_destroy(lVar4);
                __ptr->script_paths = pvVar2;
                uVar7 = thread_id_get_current();
                __ptr->init_thread_id = uVar7;
                ppVar8 = loader_host_initialize();
                __ptr->host = ppVar8;
                if (ppVar8 != (plugin)0x0) {
                  return __ptr;
                }
                log_write_impl_va("metacall",0xa8,"loader_manager_impl_initialize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                                  ,3,"Loader failed to initialize the host loader");
                loader_manager_impl_script_paths_destroy(pvVar2);
                psVar3 = __ptr->destroy_map;
                goto LAB_00107aab;
              }
              if ((*(char *)(lVar4 + uVar10) == '\0') || (*(char *)(lVar4 + uVar10) == ':')) break;
              uVar10 = uVar10 + 1;
              __size = __size + 1;
            }
            *(undefined1 *)(lVar4 + uVar10) = 0;
            vector_push_back_empty(local_1040);
            puVar5 = (undefined8 *)vector_back(pvVar2);
            pvVar6 = malloc(__size);
            *puVar5 = pvVar6;
            if (pvVar6 == (void *)0x0) {
              log_write_impl_va("metacall",0x62,"loader_manager_impl_script_paths_initialize",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                                ,0,"Loader script path failed to allocate: %s",uVar11 + lVar4);
            }
            else {
              portability_path_canonical(uVar11 + lVar4,__size,pvVar6,__size);
            }
            uVar11 = uVar10 + 1;
          } while( true );
        }
        log_write_impl_va("metacall",0x9e,"loader_manager_impl_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                          ,3,"Loader failed to initialize the script paths");
LAB_00107aab:
        set_destroy(psVar3);
        pvVar2 = __ptr->initialization_order;
      }
      vector_destroy(pvVar2);
    }
    free(__ptr);
  }
  return (loader_manager_impl)0x0;
}

Assistant:

loader_manager_impl loader_manager_impl_initialize(void)
{
	loader_manager_impl manager_impl = malloc(sizeof(struct loader_manager_impl_type));

	if (manager_impl == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate its implementation");
		goto alloc_error;
	}

	manager_impl->initialization_order = vector_create(sizeof(struct loader_initialization_order_type));

	if (manager_impl->initialization_order == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate the initialization order vector");
		goto initialization_order_error;
	}

	manager_impl->destroy_map = set_create(&hash_callback_ptr, &comparable_callback_ptr);

	if (manager_impl->destroy_map == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate the destroy map");
		goto destroy_map_error;
	}

	manager_impl->script_paths = loader_manager_impl_script_paths_initialize();

	if (manager_impl->script_paths == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to initialize the script paths");
		goto script_paths_error;
	}

	manager_impl->init_thread_id = thread_id_get_current();

	manager_impl->host = loader_host_initialize();

	if (manager_impl->host == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to initialize the host loader");
		goto host_error;
	}

	return manager_impl;

host_error:
	loader_manager_impl_script_paths_destroy(manager_impl->script_paths);
script_paths_error:
	set_destroy(manager_impl->destroy_map);
destroy_map_error:
	vector_destroy(manager_impl->initialization_order);
initialization_order_error:
	free(manager_impl);
alloc_error:
	return NULL;
}